

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1507.c
# Opt level: O0

int test(char *URL)

{
  timeval older;
  undefined8 uVar1;
  __suseconds_t _Var2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  timeval newer;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  long lStack_208;
  uint __i;
  long curl_timeo;
  undefined1 local_1f8 [4];
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  undefined1 auStack_70 [4];
  int rc;
  timeval timeout;
  __suseconds_t local_58;
  undefined8 uStack_48;
  CURLMcode ec;
  curl_slist *rcpt_list;
  timeval mp_start;
  long lStack_28;
  int still_running;
  CURLM *mcurl;
  CURL *curl;
  int res;
  char *URL_local;
  
  curl._4_4_ = 0;
  lStack_28 = 0;
  mp_start.tv_usec._4_4_ = 1;
  uStack_48 = 0;
  curl_global_init(3);
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1507.c"
                  ,0x4b);
    curl._4_4_ = 0x7c;
  }
  if (curl._4_4_ == 0) {
    lStack_28 = curl_multi_init();
    if (lStack_28 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1507.c"
                    ,0x4d);
      curl._4_4_ = 0x7b;
    }
    if (curl._4_4_ == 0) {
      uStack_48 = curl_slist_append(0,"<1507-recipient@example.com>");
      curl_easy_setopt(lVar4,0x2712,URL);
      curl_easy_setopt(lVar4,0x2e,1);
      curl_easy_setopt(lVar4,0x4e2c,read_callback);
      curl_easy_setopt(lVar4,0x27ca,"<1507-realuser@example.com>");
      curl_easy_setopt(lVar4,0x27cb,uStack_48);
      curl_easy_setopt(lVar4,0x29,1);
      iVar3 = curl_multi_add_handle(lStack_28,lVar4);
      uVar1 = _stderr;
      if (iVar3 != 0) {
        uVar5 = curl_multi_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1507.c"
                      ,0x5e,iVar3,uVar5);
        curl._4_4_ = iVar3;
      }
      if (curl._4_4_ == 0) {
        join_0x00000010_0x00000000_ = tvnow();
        _Var2 = timeout.tv_usec;
        mp_start.tv_sec = local_58;
        curl_multi_perform(lStack_28,(undefined1 *)((long)&mp_start.tv_usec + 4));
        while (mp_start.tv_usec._4_4_ != 0) {
          curl_timeo._4_4_ = -1;
          lStack_208 = -1;
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
          }
          for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
            fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
          }
          for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
            *(undefined8 *)(local_1f8 + (ulong)__arr_2._4_4_ * 8) = 0;
          }
          _auStack_70 = 1;
          timeout.tv_sec = 0;
          curl_multi_timeout(lStack_28,&stack0xfffffffffffffdf8);
          if (-1 < lStack_208) {
            _auStack_70 = lStack_208 / 1000;
            if (_auStack_70 < 2) {
              timeout.tv_sec = (lStack_208 % 1000) * 1000;
            }
            else {
              _auStack_70 = 1;
            }
          }
          curl_multi_fdset(lStack_28,fdwrite.__fds_bits + 0xf,fdexcep.__fds_bits + 0xf,local_1f8,
                           (long)&curl_timeo + 4);
          iVar3 = select(curl_timeo._4_4_ + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                         (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)local_1f8,
                         (timeval *)auStack_70);
          newer = tvnow();
          older.tv_usec = mp_start.tv_sec;
          older.tv_sec = _Var2;
          lVar6 = tvdiff(newer,older);
          if (60000 < lVar6) {
            curl_mfprintf(_stderr,"ABORTING TEST, since it seems that it would have run forever.\n")
            ;
            break;
          }
          if (iVar3 != -1) {
            curl_multi_perform(lStack_28,(undefined1 *)((long)&mp_start.tv_usec + 4));
          }
        }
      }
    }
  }
  curl_slist_free_all(uStack_48);
  curl_multi_remove_handle(lStack_28,lVar4);
  curl_multi_cleanup(lStack_28);
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  return curl._4_4_;
}

Assistant:

int test(char *URL)
{
   int res = 0;
   CURL *curl = NULL;
   CURLM *mcurl = NULL;
   int still_running = 1;
   struct timeval mp_start;
   struct curl_slist *rcpt_list = NULL;

   curl_global_init(CURL_GLOBAL_DEFAULT);

   easy_init(curl);

   multi_init(mcurl);

   rcpt_list = curl_slist_append(rcpt_list, RECIPIENT);
   /* more addresses can be added here
      rcpt_list = curl_slist_append(rcpt_list, "<others@example.com>");
   */

   curl_easy_setopt(curl, CURLOPT_URL, URL);
#if 0
   curl_easy_setopt(curl, CURLOPT_USERNAME, USERNAME);
   curl_easy_setopt(curl, CURLOPT_PASSWORD, PASSWORD);
#endif
   curl_easy_setopt(curl, CURLOPT_UPLOAD, 1L);
   curl_easy_setopt(curl, CURLOPT_READFUNCTION, read_callback);
   curl_easy_setopt(curl, CURLOPT_MAIL_FROM, MAILFROM);
   curl_easy_setopt(curl, CURLOPT_MAIL_RCPT, rcpt_list);
   curl_easy_setopt(curl, CURLOPT_VERBOSE, 1L);
   multi_add_handle(mcurl, curl);

   mp_start = tvnow();

  /* we start some action by calling perform right away */
  curl_multi_perform(mcurl, &still_running);

  while(still_running) {
    struct timeval timeout;
    int rc; /* select() return code */

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -1;

    long curl_timeo = -1;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    curl_multi_timeout(mcurl, &curl_timeo);
    if(curl_timeo >= 0) {
      timeout.tv_sec = curl_timeo / 1000;
      if(timeout.tv_sec > 1)
        timeout.tv_sec = 1;
      else
        timeout.tv_usec = (curl_timeo % 1000) * 1000;
    }

    /* get file descriptors from the transfers */
    curl_multi_fdset(mcurl, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* In a real-world program you OF COURSE check the return code of the
       function calls.  On success, the value of maxfd is guaranteed to be
       greater or equal than -1.  We call select(maxfd + 1, ...), specially in
       case of (maxfd == -1), we call select(0, ...), which is basically equal
       to sleep. */

    rc = select(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    if(tvdiff(tvnow(), mp_start) > MULTI_PERFORM_HANG_TIMEOUT) {
      fprintf(stderr, "ABORTING TEST, since it seems "
              "that it would have run forever.\n");
      break;
    }

    switch(rc) {
    case -1:
      /* select error */
      break;
    case 0: /* timeout */
    default: /* action */
      curl_multi_perform(mcurl, &still_running);
      break;
    }
  }

test_cleanup:

  curl_slist_free_all(rcpt_list);
  curl_multi_remove_handle(mcurl, curl);
  curl_multi_cleanup(mcurl);
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}